

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

int telnet_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  int *piVar1;
  char *pcVar2;
  uint local_45c;
  uint local_458;
  uint l;
  uint i;
  uint rs;
  char *output;
  char buffer [1024];
  va_list va_temp;
  __va_list_tag *va_local;
  char *fmt_local;
  telnet_t *telnet_local;
  
  _i = &output;
  buffer._1016_8_ = *(undefined8 *)va;
  l = vsnprintf((char *)&output,0x400,fmt,buffer + 0x3f8);
  if (0x3ff < l) {
    _i = (char **)malloc((ulong)(l + 1));
    if (_i == (char **)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      _error(telnet,0x5c8,"telnet_vprintf",TELNET_ENOMEM,0,"malloc() failed: %s",pcVar2);
      return -1;
    }
    buffer._1016_8_ = *(undefined8 *)va;
    l = vsnprintf((char *)_i,(ulong)(l + 1),fmt,buffer + 0x3f8);
  }
  local_45c = 0;
  for (local_458 = 0; local_458 != l; local_458 = local_458 + 1) {
    if (((*(char *)((long)_i + (ulong)local_458) == -1) ||
        (*(char *)((long)_i + (ulong)local_458) == '\r')) ||
       (*(char *)((long)_i + (ulong)local_458) == '\n')) {
      if (local_458 != local_45c) {
        _send(telnet,(char *)((long)_i + (ulong)local_45c),(ulong)(local_458 - local_45c));
      }
      local_45c = local_458 + 1;
      if (*(char *)((long)_i + (ulong)local_458) == -1) {
        telnet_iac(telnet,0xff);
      }
      else if (*(char *)((long)_i + (ulong)local_458) == '\r') {
        _send(telnet,"\r",2);
      }
      else if (*(char *)((long)_i + (ulong)local_458) == '\n') {
        _send(telnet,"\r\n",2);
      }
    }
  }
  if (local_458 != local_45c) {
    _send(telnet,(char *)((long)_i + (ulong)local_45c),(ulong)(local_458 - local_45c));
  }
  if (_i != &output) {
    free(_i);
  }
  return l;
}

Assistant:

int telnet_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs, i, l;

	/* format */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send */
	for (l = i = 0; i != rs; ++i) {
		/* special characters */
		if (output[i] == (char)TELNET_IAC || output[i] == '\r' ||
				output[i] == '\n') {
			/* dump prior portion of text */
			if (i != l)
				_send(telnet, output + l, i - l);
			l = i + 1;

			/* IAC -> IAC IAC */
			if (output[i] == (char)TELNET_IAC)
				telnet_iac(telnet, TELNET_IAC);
			/* automatic translation of \r -> CRNUL */
			else if (output[i] == '\r')
				_send(telnet, CRNUL, 2);
			/* automatic translation of \n -> CRLF */
			else if (output[i] == '\n')
				_send(telnet, CRLF, 2);
		}
	}

	/* send whatever portion of output is left */
	if (i != l) {
		_send(telnet, output + l, i - l);
	}

	/* free allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}